

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_add_mpi(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  int iVar2;
  
  iVar2 = A->s;
  if (B->s * iVar2 < 0) {
    iVar1 = mbedtls_mpi_cmp_abs(A,B);
    if (iVar1 < 0) {
      iVar1 = mbedtls_mpi_sub_abs(X,B,A);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar2 = -iVar2;
      goto LAB_0011475c;
    }
    iVar1 = mbedtls_mpi_sub_abs(X,A,B);
  }
  else {
    iVar1 = mbedtls_mpi_add_abs(X,A,B);
  }
  if (iVar1 != 0) {
    return iVar1;
  }
LAB_0011475c:
  X->s = iVar2;
  return 0;
}

Assistant:

int mbedtls_mpi_add_mpi( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret, s = A->s;

    if( A->s * B->s < 0 )
    {
        if( mbedtls_mpi_cmp_abs( A, B ) >= 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( X, A, B ) );
            X->s =  s;
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( X, B, A ) );
            X->s = -s;
        }
    }
    else
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( X, A, B ) );
        X->s = s;
    }

cleanup:

    return( ret );
}